

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_function_catalog_entry.cpp
# Opt level: O2

unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true> __thiscall
duckdb::ScalarFunctionCatalogEntry::AlterEntry
          (ScalarFunctionCatalogEntry *this,CatalogTransaction transaction,AlterInfo *info)

{
  vector<duckdb::FunctionDescription,_true> *this_00;
  __normal_iterator<duckdb::FunctionDescription_*,_std::vector<duckdb::FunctionDescription,_std::allocator<duckdb::FunctionDescription>_>_>
  __first;
  bool bVar1;
  pointer pCVar2;
  InternalException *pIVar3;
  BinderException *this_01;
  long in_RDX;
  unique_ptr<duckdb::CreateScalarFunctionInfo,_std::default_delete<duckdb::CreateScalarFunctionInfo>,_true>
  *this_02;
  _func_int **local_2b8;
  ScalarFunctionSet new_set;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  FunctionSet<duckdb::ScalarFunction> local_258;
  FunctionSet<duckdb::ScalarFunction> local_220;
  CreateScalarFunctionInfo new_info;
  
  if (*(char *)(in_RDX + 9) != '\x05') {
    pIVar3 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&new_info,
               "Attempting to alter ScalarFunctionCatalogEntry with unsupported alter type",
               (allocator *)&new_set);
    InternalException::InternalException(pIVar3,(string *)&new_info);
    __cxa_throw(pIVar3,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (*(char *)(in_RDX + 0x71) == '\x01') {
    FunctionSet<duckdb::ScalarFunction>::FunctionSet
              (&new_set.super_FunctionSet<duckdb::ScalarFunction>,
               (FunctionSet<duckdb::ScalarFunction> *)((long)&info[2].name.field_2 + 8));
    this_02 = (unique_ptr<duckdb::CreateScalarFunctionInfo,_std::default_delete<duckdb::CreateScalarFunctionInfo>,_true>
               *)(in_RDX + 0x78);
    pCVar2 = unique_ptr<duckdb::CreateScalarFunctionInfo,_std::default_delete<duckdb::CreateScalarFunctionInfo>,_true>
             ::operator->(this_02);
    FunctionSet<duckdb::ScalarFunction>::FunctionSet
              (&local_258,&(pCVar2->functions).super_FunctionSet<duckdb::ScalarFunction>);
    bVar1 = FunctionSet<duckdb::ScalarFunction>::MergeFunctionSet
                      (&new_set.super_FunctionSet<duckdb::ScalarFunction>,&local_258,true);
    FunctionSet<duckdb::ScalarFunction>::~FunctionSet(&local_258);
    if (bVar1) {
      FunctionSet<duckdb::ScalarFunction>::FunctionSet
                (&local_220,&new_set.super_FunctionSet<duckdb::ScalarFunction>);
      CreateScalarFunctionInfo::CreateScalarFunctionInfo(&new_info,(ScalarFunctionSet *)&local_220);
      FunctionSet<duckdb::ScalarFunction>::~FunctionSet(&local_220);
      new_info.super_CreateFunctionInfo.super_CreateInfo.internal =
           (bool)(info->schema).field_2._M_local_buf[2];
      this_00 = &new_info.super_CreateFunctionInfo.descriptions;
      ::std::vector<duckdb::FunctionDescription,_std::allocator<duckdb::FunctionDescription>_>::
      operator=(&this_00->
                 super_vector<duckdb::FunctionDescription,_std::allocator<duckdb::FunctionDescription>_>
                ,(vector<duckdb::FunctionDescription,_std::allocator<duckdb::FunctionDescription>_>
                  *)&info[2].name);
      pCVar2 = unique_ptr<duckdb::CreateScalarFunctionInfo,_std::default_delete<duckdb::CreateScalarFunctionInfo>,_true>
               ::operator->(this_02);
      __first._M_current =
           (pCVar2->super_CreateFunctionInfo).descriptions.
           super_vector<duckdb::FunctionDescription,_std::allocator<duckdb::FunctionDescription>_>.
           super__Vector_base<duckdb::FunctionDescription,_std::allocator<duckdb::FunctionDescription>_>
           ._M_impl.super__Vector_impl_data._M_start;
      pCVar2 = unique_ptr<duckdb::CreateScalarFunctionInfo,_std::default_delete<duckdb::CreateScalarFunctionInfo>,_true>
               ::operator->(this_02);
      ::std::vector<duckdb::FunctionDescription,std::allocator<duckdb::FunctionDescription>>::
      insert<__gnu_cxx::__normal_iterator<duckdb::FunctionDescription*,std::vector<duckdb::FunctionDescription,std::allocator<duckdb::FunctionDescription>>>,void>
                ((vector<duckdb::FunctionDescription,std::allocator<duckdb::FunctionDescription>> *)
                 this_00,(const_iterator)
                         new_info.super_CreateFunctionInfo.descriptions.
                         super_vector<duckdb::FunctionDescription,_std::allocator<duckdb::FunctionDescription>_>
                         .
                         super__Vector_base<duckdb::FunctionDescription,_std::allocator<duckdb::FunctionDescription>_>
                         ._M_impl.super__Vector_impl_data._M_finish,__first,
                 (pCVar2->super_CreateFunctionInfo).descriptions.
                 super_vector<duckdb::FunctionDescription,_std::allocator<duckdb::FunctionDescription>_>
                 .
                 super__Vector_base<duckdb::FunctionDescription,_std::allocator<duckdb::FunctionDescription>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      make_uniq<duckdb::ScalarFunctionCatalogEntry,duckdb::Catalog&,duckdb::SchemaCatalogEntry&,duckdb::CreateScalarFunctionInfo&>
                ((duckdb *)&local_2b8,(Catalog *)info[1].name.field_2._M_allocated_capacity,
                 *(SchemaCatalogEntry **)((long)&info[1].name.field_2 + 8),&new_info);
      (this->super_FunctionEntry).super_StandardEntry.super_InCatalogEntry.super_CatalogEntry.
      _vptr_CatalogEntry = local_2b8;
      CreateScalarFunctionInfo::~CreateScalarFunctionInfo(&new_info);
      FunctionSet<duckdb::ScalarFunction>::~FunctionSet
                (&new_set.super_FunctionSet<duckdb::ScalarFunction>);
      return (unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>)
             (unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>)this;
    }
    this_01 = (BinderException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&new_info,
               "Failed to add new function overloads to function \"%s\": function overload already exists"
               ,(allocator *)&local_2b8);
    ::std::__cxx11::string::string
              ((string *)&local_278,(string *)(info->catalog).field_2._M_local_buf);
    BinderException::BinderException<std::__cxx11::string>(this_01,(string *)&new_info,&local_278);
    __cxa_throw(this_01,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  pIVar3 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&new_info,
             "Attempting to alter ScalarFunctionCatalogEntry with unsupported alter scalar function type"
             ,(allocator *)&new_set);
  InternalException::InternalException(pIVar3,(string *)&new_info);
  __cxa_throw(pIVar3,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<CatalogEntry> ScalarFunctionCatalogEntry::AlterEntry(CatalogTransaction transaction, AlterInfo &info) {
	if (info.type != AlterType::ALTER_SCALAR_FUNCTION) {
		throw InternalException("Attempting to alter ScalarFunctionCatalogEntry with unsupported alter type");
	}
	auto &function_info = info.Cast<AlterScalarFunctionInfo>();
	if (function_info.alter_scalar_function_type != AlterScalarFunctionType::ADD_FUNCTION_OVERLOADS) {
		throw InternalException(
		    "Attempting to alter ScalarFunctionCatalogEntry with unsupported alter scalar function type");
	}
	auto &add_overloads = function_info.Cast<AddScalarFunctionOverloadInfo>();

	ScalarFunctionSet new_set = functions;
	if (!new_set.MergeFunctionSet(add_overloads.new_overloads->functions, true)) {
		throw BinderException(
		    "Failed to add new function overloads to function \"%s\": function overload already exists", name);
	}
	CreateScalarFunctionInfo new_info(std::move(new_set));
	new_info.internal = internal;
	new_info.descriptions = descriptions;
	new_info.descriptions.insert(new_info.descriptions.end(), add_overloads.new_overloads->descriptions.begin(),
	                             add_overloads.new_overloads->descriptions.end());
	return make_uniq<ScalarFunctionCatalogEntry>(catalog, schema, new_info);
}